

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O2

rand_gen * init_rand(char *gen_type)

{
  double dVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  param_2 pVar5;
  int iVar6;
  rand_gen *gen;
  param_3 *ppVar7;
  cpp_gen *pcVar8;
  code *pcVar9;
  char hostname [64];
  
  gen = (rand_gen *)malloc(0x34);
  if (gen == (rand_gen *)0x0) {
    __assert_fail("gen",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/rand_gen.c"
                  ,0x150,"struct rand_gen *init_rand(char *)");
  }
  iVar6 = strncmp(gen_type,"fixed",5);
  if (iVar6 == 0) {
    ppVar7 = (param_3 *)parse_param_1(gen_type);
    gen->set_avg = fixed_set_avg;
    gen->inv_cdf = fixed_inv_cdf;
    gen->generate = (_func_double_rand_gen_ptr *)0x0;
    gen->gen_type = 1;
LAB_00105b08:
    dVar1 = ppVar7->a;
  }
  else {
    cVar4 = *gen_type;
    if (cVar4 != 'e') {
      if (cVar4 == 'u') {
        if ((gen_type[1] == 'n') && (gen_type[2] == 'i')) {
          ppVar7 = (param_3 *)parse_param_1(gen_type);
          pcVar9 = uni_generate;
          goto LAB_00105b04;
        }
      }
      else if ((cVar4 == 'r') && (gen_type[1] == 'r')) {
        ppVar7 = (param_3 *)parse_param_1(gen_type);
        pcVar9 = rr_generate;
LAB_00105b04:
        gen->generate = pcVar9;
        goto LAB_00105b08;
      }
LAB_00105b63:
      iVar6 = strncmp(gen_type,"pareto",6);
      if (iVar6 == 0) goto LAB_00105cf2;
      if (((cVar4 == 'g') && (gen_type[1] == 'e')) && (gen_type[2] == 'v')) {
LAB_00105c83:
        ppVar7 = parse_param_3(gen_type);
        dVar1 = ppVar7->b;
        (gen->params).p1.a = ppVar7->a;
        (gen->params).p2.b = dVar1;
        (gen->params).p3.c = ppVar7->c;
        gen->set_avg = gev_set_avg;
        gen->inv_cdf = gev_inv_cdf;
        gen->generate = (_func_double_rand_gen_ptr *)0x0;
        gen->gen_type = 0;
        return gen;
      }
      iVar6 = strcmp(gen_type,"fb_key");
      if (iVar6 == 0) {
        builtin_strncpy(hostname + 0x10,"449:0.078688",0xd);
        builtin_strncpy(hostname,"gev:30.7984:8.20",0x10);
        gen_type = hostname;
        goto LAB_00105c83;
      }
      iVar6 = strcmp(gen_type,"fb_ia");
      if (iVar6 == 0) {
        builtin_strncpy(hostname,"gpar:0:16.0292:0.154971",0x18);
        gen_type = hostname;
LAB_00105cf2:
        ppVar7 = parse_param_3(gen_type);
        gpar_init(gen,ppVar7);
        return gen;
      }
      iVar6 = strcmp(gen_type,"fb_val");
      if (iVar6 == 0) {
        builtin_strncpy(hostname + 0x10,"6:0.348238",0xb);
        builtin_strncpy(hostname,"gpar:15.0:214.47",0x10);
        gen_type = hostname;
        goto LAB_00105cf2;
      }
      iVar6 = strncmp(gen_type,"bimodal",7);
      if (iVar6 == 0) {
        ppVar7 = parse_param_3(gen_type);
        dVar1 = ppVar7->b;
        (gen->params).p1.a = ppVar7->a;
        (gen->params).p2.b = dVar1;
        (gen->params).p3.c = ppVar7->c;
        gen->set_avg = bimodal_set_avg;
        gen->inv_cdf = bimodal_inv_cdf;
        gen->generate = (_func_double_rand_gen_ptr *)0x0;
        gen->gen_type = 0;
      }
      else {
        iVar6 = strncmp(gen_type,"lognorm",7);
        if (iVar6 != 0) {
          iVar6 = strncmp(gen_type,"gamma",5);
          if (iVar6 != 0) {
            gethostname(hostname,0x40);
            fprintf(_stderr,"[%s] ",hostname);
            fprintf(_stderr,"Unknown generator type %s\n",gen_type);
            return (rand_gen *)0x0;
          }
          parse_param_2(gen_type);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/rand_gen.c"
                        ,0x10f,"void gamma_init(struct rand_gen *, struct param_2 *)");
        }
        ppVar7 = (param_3 *)parse_param_2(gen_type);
        pcVar8 = new_normal_gen();
        (gen->params).lgp.ng = pcVar8;
        dVar2 = ppVar7->a;
        dVar3 = ppVar7->b;
        pVar5.b._0_4_ = SUB84(dVar2,0);
        pVar5.a = dVar3;
        pVar5.b._4_4_ = (int)((ulong)dVar2 >> 0x20);
        (gen->params).p2 = pVar5;
        gen->generate = lognorm_generate;
        gen->set_avg = lognorm_set_avg;
        gen->inv_cdf = lognorm_inv_cdf;
        gen->gen_type = 0;
      }
      goto LAB_00105b14;
    }
    if ((gen_type[1] != 'x') || (gen_type[2] != 'p')) goto LAB_00105b63;
    ppVar7 = (param_3 *)parse_param_1(gen_type);
    gen->set_avg = exp_set_avg;
    gen->inv_cdf = exp_inv_cdf;
    gen->generate = (_func_double_rand_gen_ptr *)0x0;
    gen->gen_type = 2;
    dVar1 = 1.0 / ppVar7->a;
  }
  (gen->params).p1.a = dVar1;
LAB_00105b14:
  free(ppVar7);
  return gen;
}

Assistant:

struct rand_gen *init_rand(char *gen_type)
{
	struct rand_gen *gen = (struct rand_gen *)malloc(sizeof(struct rand_gen));
	assert(gen);

	if (strncmp(gen_type, "fixed", 5) == 0)
		fixed_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "rr", 2) == 0)
		rr_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "uni", 3) == 0)
		uni_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "exp", 3) == 0)
		exp_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "pareto", 6) == 0)
		gpar_init(gen, parse_param_3(gen_type));
	else if (strncmp(gen_type, "gev", 3) == 0)
		gev_init(gen, parse_param_3(gen_type));
	else if (strcmp(gen_type, "fb_key") == 0) {
		char type[] = "gev:30.7984:8.20449:0.078688";
		gev_init(gen, parse_param_3(type));
	} else if (strcmp(gen_type, "fb_ia") == 0) {
		char type[] = "gpar:0:16.0292:0.154971";
		gpar_init(gen, parse_param_3(type));
	} else if (strcmp(gen_type, "fb_val") == 0) {
		/* WARNING: this is not exactly the same as mutilate */
		char type[] = "gpar:15.0:214.476:0.348238";
		gpar_init(gen, parse_param_3(type));
	} else if (strncmp(gen_type, "bimodal", 7) == 0)
		bimodal_init(gen, parse_param_3(gen_type));
	else if (strncmp(gen_type, "lognorm", 7) == 0)
		lognormal_init(gen, parse_param_2(gen_type));
	else if (strncmp(gen_type, "gamma", 5) == 0)
		gamma_init(gen, parse_param_2(gen_type));
	else {
		lancet_fprintf(stderr, "Unknown generator type %s\n", gen_type);
		return NULL;
	}
	return gen;
}